

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,float kappa,float delta,float theta)

{
  solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
  *reduced_cost;
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *plVar1;
  bool bVar2;
  uint r_size;
  int selected;
  long lVar3;
  row_iterator prVar4;
  int *piVar5;
  rc_data *ret_1;
  rc_data *prVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  rc_data *prVar12;
  rc_data *ret;
  long lVar13;
  int iVar14;
  string_view fmt;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  float local_7c;
  float local_78;
  float local_74;
  solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
  *local_70;
  solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
  *local_68;
  bit_array *local_60;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_58;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *local_50;
  solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
  *local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  row_iterator local_38;
  
  fmt._M_str = "update-row {} {} {}\n";
  fmt._M_len = 0x14;
  local_7c = theta;
  local_78 = delta;
  local_74 = kappa;
  local_60 = x;
  debug_logger<true>::log<float,float,float>
            ((debug_logger<true> *)this,fmt,&local_74,&local_78,&local_7c);
  if ((first->current)._M_current == (last->current)._M_current) {
    bVar7 = false;
  }
  else {
    local_48 = this + 0x10;
    reduced_cost = this + 0x60;
    local_68 = this + 0xe8;
    local_70 = this + 0x80;
    bVar7 = false;
    local_58 = last;
    local_50 = first;
    do {
      k = (local_50->current)._M_current[-1];
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_40,(int)local_48);
      if (local_38 != (row_iterator)local_40._M_head_impl) {
        lVar13 = *(long *)(this + 0x50);
        prVar4 = local_38;
        do {
          *(float *)(lVar13 + (long)prVar4->value * 4) =
               local_7c * *(float *)(lVar13 + (long)prVar4->value * 4);
          prVar4 = prVar4 + 1;
        } while (prVar4 != (row_iterator)local_40._M_head_impl);
      }
      lVar13 = (long)k;
      r_size = solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                           *)this,local_38,(row_iterator)local_40._M_head_impl,local_60);
      selected = -2;
      switch(*(undefined1 *)(*(long *)(this + 0x68) + lVar13)) {
      case 0:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar6 = *(rc_data **)(this + 0x60);
          lVar3 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar6,prVar6 + lVar3,(int)LZCOUNT(lVar3) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar6,prVar6 + lVar3);
          prVar12 = prVar6 + 1;
          lVar3 = lVar3 * 0xc + -0xc;
          do {
            if ((prVar6->value != prVar12->value) || (NAN(prVar6->value) || NAN(prVar12->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar6,prVar12,plVar1);
              prVar6 = prVar12;
            }
            prVar12 = prVar12 + 1;
            lVar3 = lVar3 + -0xc;
          } while (lVar3 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar6,prVar12,plVar1);
        }
        iVar9 = *(int *)(*(long *)(this + 0x70) + lVar13 * 0xc);
        iVar10 = *(int *)(*(long *)(this + 0x70) + 4 + lVar13 * 0xc);
LAB_005201f7:
        selected = branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[]>>>
                             ((branch_and_bound_solver<baryonyx::itm::minimize_tag,float> *)local_70
                              ,(unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
                                *)reduced_cost,r_size,iVar9,iVar10);
        break;
      case 1:
switchD_0051fdf9_caseD_1:
        selected = exhaustive_solver<baryonyx::itm::minimize_tag,float>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data[]>>>
                             ((exhaustive_solver<baryonyx::itm::minimize_tag,float> *)local_68,k,
                              (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>_>
                               *)reduced_cost,r_size);
        break;
      case 2:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar6 = *(rc_data **)(this + 0x60);
          lVar3 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar6,prVar6 + lVar3,(int)LZCOUNT(lVar3) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar6,prVar6 + lVar3);
          prVar12 = prVar6 + 1;
          lVar3 = lVar3 * 0xc + -0xc;
          do {
            if ((prVar6->value != prVar12->value) || (NAN(prVar6->value) || NAN(prVar12->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar6,prVar12,plVar1);
              prVar6 = prVar12;
            }
            prVar12 = prVar12 + 1;
            lVar3 = lVar3 + -0xc;
          } while (lVar3 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar6,prVar12,plVar1);
        }
        iVar9 = *(int *)(*(long *)(this + 0x70) + lVar13 * 0xc);
        iVar10 = *(int *)(*(long *)(this + 0x70) + 4 + lVar13 * 0xc);
        if ((int)r_size < 0) {
          selected = -2;
        }
        else {
          piVar5 = (int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>,_true,_true>
                                   *)reduced_cost + 8);
          iVar8 = 0;
          uVar11 = 0xffffffffffffffff;
          iVar14 = -2;
          do {
            selected = (int)uVar11;
            if (iVar10 < iVar8) {
              selected = iVar14;
            }
            if (iVar8 < iVar9) {
              selected = iVar14;
            }
            if ((selected != -2) && (0.0 < (float)piVar5[-2])) break;
            uVar11 = uVar11 + 1;
            iVar8 = iVar8 + *piVar5;
            piVar5 = piVar5 + 3;
            iVar14 = selected;
          } while (r_size != uVar11);
        }
        if (selected == -2) goto LAB_005201f7;
        break;
      case 3:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar6 = *(rc_data **)(this + 0x60);
          lVar3 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar6,prVar6 + lVar3,(int)LZCOUNT(lVar3) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar6,prVar6 + lVar3);
          prVar12 = prVar6 + 1;
          lVar3 = lVar3 * 0xc + -0xc;
          do {
            if ((prVar6->value != prVar12->value) || (NAN(prVar6->value) || NAN(prVar12->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar6,prVar12,plVar1);
              prVar6 = prVar12;
            }
            prVar12 = prVar12 + 1;
            lVar3 = lVar3 + -0xc;
          } while (lVar3 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar6,prVar12,plVar1);
        }
        if ((int)r_size < 0) {
          selected = -2;
        }
        else {
          piVar5 = (int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::rc_data[]>,_true,_true>
                                   *)reduced_cost + 8);
          iVar10 = 0;
          uVar11 = 0xffffffffffffffff;
          iVar9 = -2;
          do {
            selected = (int)uVar11;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar13 * 0xc) < iVar10) {
              selected = iVar9;
            }
            if (iVar10 < *(int *)(*(long *)(this + 0x70) + lVar13 * 0xc)) {
              selected = iVar9;
            }
            if ((selected != -2) && (0.0 < (float)piVar5[-2])) break;
            uVar11 = uVar11 + 1;
            iVar10 = iVar10 + *piVar5;
            piVar5 = piVar5 + 3;
            iVar9 = selected;
          } while (r_size != uVar11);
        }
        if (selected == -2) goto switchD_0051fdf9_caseD_1;
        break;
      case 4:
        if (1 < (int)r_size) {
          plVar1 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar6 = *(rc_data **)(this + 0x60);
          lVar3 = (long)(int)r_size;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar6,prVar6 + lVar3,(int)LZCOUNT(lVar3) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar6,prVar6 + lVar3);
          prVar12 = prVar6 + 1;
          lVar3 = lVar3 * 0xc + -0xc;
          do {
            if ((prVar6->value != prVar12->value) || (NAN(prVar6->value) || NAN(prVar12->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar6,prVar12,plVar1);
              prVar6 = prVar12;
            }
            prVar12 = prVar12 + 1;
            lVar3 = lVar3 + -0xc;
          } while (lVar3 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<float>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar6,prVar12,plVar1);
          last = local_58;
        }
        if (-1 < (int)r_size) {
          piVar5 = (int *)(*(long *)(this + 0x60) + 8);
          iVar9 = 0;
          selected = -2;
          uVar11 = 0xffffffffffffffff;
          do {
            iVar10 = (int)uVar11;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar13 * 0xc) < iVar9) {
              iVar10 = selected;
            }
            if (iVar9 < *(int *)(*(long *)(this + 0x70) + lVar13 * 0xc)) {
              iVar10 = selected;
            }
            selected = iVar10;
            if ((selected != -2) && (0.0 < (float)piVar5[-2])) break;
            uVar11 = uVar11 + 1;
            iVar9 = iVar9 + *piVar5;
            piVar5 = piVar5 + 3;
          } while (r_size != uVar11);
        }
      }
      bVar2 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                        (this,local_60,local_38,k,selected,r_size,local_74,local_78);
      bVar7 = (bool)(bVar7 | bVar2);
      piVar5 = (local_50->current)._M_current + -1;
      (local_50->current)._M_current = piVar5;
    } while (piVar5 != (last->current)._M_current);
  }
  return bVar7;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);
            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            Float pi_change;
            int selected = -2;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }